

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O1

void __thiscall
ExchCXX::detail::LibxcKernelImpl::eval_exc_vxc_
          (LibxcKernelImpl *this,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
          const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
          host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,host_buffer_type vtau
          )

{
  int iVar1;
  exchcxx_exception *this_00;
  string local_70;
  string local_50;
  
  throw_if_uninitialized(this);
  iVar1 = (*(this->super_XCKernelImpl)._vptr_XCKernelImpl[5])(this);
  if ((char)iVar1 != '\0') {
    xc_mgga_exc_vxc(&this->kernel_,(long)N,rho,sigma,lapl,tau,eps,vrho,vsigma,vlapl,vtau);
    return;
  }
  this_00 = (exchcxx_exception *)__cxa_allocate_exception(0x50);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/src/libxc.cxx"
             ,"");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"KERNEL IS NOT MGGA","");
  exchcxx_exception::exchcxx_exception(this_00,&local_50,0x13f,&local_70);
  __cxa_throw(this_00,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
}

Assistant:

MGGA_EXC_VXC_GENERATOR( LibxcKernelImpl::eval_exc_vxc_ ) const {

  throw_if_uninitialized();
  EXCHCXX_BOOL_CHECK("KERNEL IS NOT MGGA",  is_mgga() );
  xc_mgga_exc_vxc( &kernel_, N, rho, sigma, lapl, tau, eps, vrho, vsigma, vlapl, vtau );

}